

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void Corrade::Utility::String::Implementation::anon_unknown_13::anon_func::anon_class_1_0_00000001::
     __invoke(char *data,size_t size)

{
  char *pcVar1;
  ostream *output;
  char *pcVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  Error local_30;
  
  switch(size) {
  case 0:
    break;
  case 0xf:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 0xe:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 0xd:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 0xc:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 0xb:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 10:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 9:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 8:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 7:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 6:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 5:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 4:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 3:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 2:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    data = data + 1;
  case 1:
    *data = (0x19 < (byte)(*data + 0x9fU)) * ' ' + *data + -0x20;
    break;
  default:
    bVar4 = *data + 0x85;
    bVar5 = data[1] + 0x85;
    bVar6 = data[2] + 0x85;
    bVar7 = data[3] + 0x85;
    bVar8 = data[4] + 0x85;
    bVar9 = data[5] + 0x85;
    bVar10 = data[6] + 0x85;
    bVar11 = data[7] + 0x85;
    bVar12 = data[8] + 0x85;
    bVar13 = data[9] + 0x85;
    bVar14 = data[10] + 0x85;
    bVar15 = data[0xb] + 0x85;
    bVar16 = data[0xc] + 0x85;
    bVar17 = data[0xd] + 0x85;
    bVar18 = data[0xe] + 0x85;
    bVar19 = data[0xf] + 0x85;
    *data = (-((byte)((0xe6 < bVar4) * bVar4 | (0xe6 >= bVar4) * -0x1a) == bVar4) & 0xe0U) + *data;
    data[1] = (-((byte)((0xe6 < bVar5) * bVar5 | (0xe6 >= bVar5) * -0x1a) == bVar5) & 0xe0U) +
              data[1];
    data[2] = (-((byte)((0xe6 < bVar6) * bVar6 | (0xe6 >= bVar6) * -0x1a) == bVar6) & 0xe0U) +
              data[2];
    data[3] = (-((byte)((0xe6 < bVar7) * bVar7 | (0xe6 >= bVar7) * -0x1a) == bVar7) & 0xe0U) +
              data[3];
    data[4] = (-((byte)((0xe6 < bVar8) * bVar8 | (0xe6 >= bVar8) * -0x1a) == bVar8) & 0xe0U) +
              data[4];
    data[5] = (-((byte)((0xe6 < bVar9) * bVar9 | (0xe6 >= bVar9) * -0x1a) == bVar9) & 0xe0U) +
              data[5];
    data[6] = (-((byte)((0xe6 < bVar10) * bVar10 | (0xe6 >= bVar10) * -0x1a) == bVar10) & 0xe0U) +
              data[6];
    data[7] = (-((byte)((0xe6 < bVar11) * bVar11 | (0xe6 >= bVar11) * -0x1a) == bVar11) & 0xe0U) +
              data[7];
    data[8] = (-((byte)((0xe6 < bVar12) * bVar12 | (0xe6 >= bVar12) * -0x1a) == bVar12) & 0xe0U) +
              data[8];
    data[9] = (-((byte)((0xe6 < bVar13) * bVar13 | (0xe6 >= bVar13) * -0x1a) == bVar13) & 0xe0U) +
              data[9];
    data[10] = (-((byte)((0xe6 < bVar14) * bVar14 | (0xe6 >= bVar14) * -0x1a) == bVar14) & 0xe0U) +
               data[10];
    data[0xb] = (-((byte)((0xe6 < bVar15) * bVar15 | (0xe6 >= bVar15) * -0x1a) == bVar15) & 0xe0U) +
                data[0xb];
    data[0xc] = (-((byte)((0xe6 < bVar16) * bVar16 | (0xe6 >= bVar16) * -0x1a) == bVar16) & 0xe0U) +
                data[0xc];
    data[0xd] = (-((byte)((0xe6 < bVar17) * bVar17 | (0xe6 >= bVar17) * -0x1a) == bVar17) & 0xe0U) +
                data[0xd];
    data[0xe] = (-((byte)((0xe6 < bVar18) * bVar18 | (0xe6 >= bVar18) * -0x1a) == bVar18) & 0xe0U) +
                data[0xe];
    data[0xf] = (-((byte)((0xe6 < bVar19) * bVar19 | (0xe6 >= bVar19) * -0x1a) == bVar19) & 0xe0U) +
                data[0xf];
    pcVar1 = (char *)((ulong)(data + 0x10) & 0xfffffffffffffff0);
    if (pcVar1 < data) {
      output = Error::defaultOutput();
      Error::Error(&local_30,output,(Flags)0x0);
      Debug::operator<<(&local_30.super_Debug,
                        "Assertion i >= data && reinterpret_cast<std::uintptr_t>(i) % 16 == 0 failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:672"
                       );
      Error::~Error(&local_30);
      abort();
    }
    pcVar3 = data + size;
    pcVar2 = pcVar1 + 0x10;
    while (pcVar2 <= pcVar3) {
      bVar4 = *pcVar1 + 0x85;
      bVar5 = pcVar1[1] + 0x85;
      bVar6 = pcVar1[2] + 0x85;
      bVar7 = pcVar1[3] + 0x85;
      bVar8 = pcVar1[4] + 0x85;
      bVar9 = pcVar1[5] + 0x85;
      bVar10 = pcVar1[6] + 0x85;
      bVar11 = pcVar1[7] + 0x85;
      bVar12 = pcVar1[8] + 0x85;
      bVar13 = pcVar1[9] + 0x85;
      bVar14 = pcVar1[10] + 0x85;
      bVar15 = pcVar1[0xb] + 0x85;
      bVar16 = pcVar1[0xc] + 0x85;
      bVar17 = pcVar1[0xd] + 0x85;
      bVar18 = pcVar1[0xe] + 0x85;
      bVar19 = pcVar1[0xf] + 0x85;
      *pcVar1 = (-((byte)((bVar4 < 0xe6) * -0x1a | (bVar4 >= 0xe6) * bVar4) == bVar4) & 0xe0U) +
                *pcVar1;
      pcVar1[1] = (-((byte)((bVar5 < 0xe6) * -0x1a | (bVar5 >= 0xe6) * bVar5) == bVar5) & 0xe0U) +
                  pcVar1[1];
      pcVar1[2] = (-((byte)((bVar6 < 0xe6) * -0x1a | (bVar6 >= 0xe6) * bVar6) == bVar6) & 0xe0U) +
                  pcVar1[2];
      pcVar1[3] = (-((byte)((bVar7 < 0xe6) * -0x1a | (bVar7 >= 0xe6) * bVar7) == bVar7) & 0xe0U) +
                  pcVar1[3];
      pcVar1[4] = (-((byte)((bVar8 < 0xe6) * -0x1a | (bVar8 >= 0xe6) * bVar8) == bVar8) & 0xe0U) +
                  pcVar1[4];
      pcVar1[5] = (-((byte)((bVar9 < 0xe6) * -0x1a | (bVar9 >= 0xe6) * bVar9) == bVar9) & 0xe0U) +
                  pcVar1[5];
      pcVar1[6] = (-((byte)((bVar10 < 0xe6) * -0x1a | (bVar10 >= 0xe6) * bVar10) == bVar10) & 0xe0U)
                  + pcVar1[6];
      pcVar1[7] = (-((byte)((bVar11 < 0xe6) * -0x1a | (bVar11 >= 0xe6) * bVar11) == bVar11) & 0xe0U)
                  + pcVar1[7];
      pcVar1[8] = (-((byte)((bVar12 < 0xe6) * -0x1a | (bVar12 >= 0xe6) * bVar12) == bVar12) & 0xe0U)
                  + pcVar1[8];
      pcVar1[9] = (-((byte)((bVar13 < 0xe6) * -0x1a | (bVar13 >= 0xe6) * bVar13) == bVar13) & 0xe0U)
                  + pcVar1[9];
      pcVar1[10] = (-((byte)((bVar14 < 0xe6) * -0x1a | (bVar14 >= 0xe6) * bVar14) == bVar14) & 0xe0U
                   ) + pcVar1[10];
      pcVar1[0xb] = (-((byte)((bVar15 < 0xe6) * -0x1a | (bVar15 >= 0xe6) * bVar15) == bVar15) &
                    0xe0U) + pcVar1[0xb];
      pcVar1[0xc] = (-((byte)((bVar16 < 0xe6) * -0x1a | (bVar16 >= 0xe6) * bVar16) == bVar16) &
                    0xe0U) + pcVar1[0xc];
      pcVar1[0xd] = (-((byte)((bVar17 < 0xe6) * -0x1a | (bVar17 >= 0xe6) * bVar17) == bVar17) &
                    0xe0U) + pcVar1[0xd];
      pcVar1[0xe] = (-((byte)((bVar18 < 0xe6) * -0x1a | (bVar18 >= 0xe6) * bVar18) == bVar18) &
                    0xe0U) + pcVar1[0xe];
      pcVar1[0xf] = (-((byte)((bVar19 < 0xe6) * -0x1a | (bVar19 >= 0xe6) * bVar19) == bVar19) &
                    0xe0U) + pcVar1[0xf];
      pcVar2 = pcVar1 + 0x20;
      pcVar1 = pcVar1 + 0x10;
    }
    if (pcVar1 < pcVar3) {
      bVar4 = pcVar3[-0x10] + 0x85;
      bVar5 = pcVar3[-0xf] + 0x85;
      bVar6 = pcVar3[-0xe] + 0x85;
      bVar7 = pcVar3[-0xd] + 0x85;
      bVar8 = pcVar3[-0xc] + 0x85;
      bVar9 = pcVar3[-0xb] + 0x85;
      bVar10 = pcVar3[-10] + 0x85;
      bVar11 = pcVar3[-9] + 0x85;
      bVar12 = pcVar3[-8] + 0x85;
      bVar13 = pcVar3[-7] + 0x85;
      bVar14 = pcVar3[-6] + 0x85;
      bVar15 = pcVar3[-5] + 0x85;
      bVar16 = pcVar3[-4] + 0x85;
      bVar17 = pcVar3[-3] + 0x85;
      bVar18 = pcVar3[-2] + 0x85;
      bVar19 = pcVar3[-1] + 0x85;
      pcVar3[-0x10] =
           (-((byte)((0xe6 < bVar4) * bVar4 | (0xe6 >= bVar4) * -0x1a) == bVar4) & 0xe0U) +
           pcVar3[-0x10];
      pcVar3[-0xf] = (-((byte)((0xe6 < bVar5) * bVar5 | (0xe6 >= bVar5) * -0x1a) == bVar5) & 0xe0U)
                     + pcVar3[-0xf];
      pcVar3[-0xe] = (-((byte)((0xe6 < bVar6) * bVar6 | (0xe6 >= bVar6) * -0x1a) == bVar6) & 0xe0U)
                     + pcVar3[-0xe];
      pcVar3[-0xd] = (-((byte)((0xe6 < bVar7) * bVar7 | (0xe6 >= bVar7) * -0x1a) == bVar7) & 0xe0U)
                     + pcVar3[-0xd];
      pcVar3[-0xc] = (-((byte)((0xe6 < bVar8) * bVar8 | (0xe6 >= bVar8) * -0x1a) == bVar8) & 0xe0U)
                     + pcVar3[-0xc];
      pcVar3[-0xb] = (-((byte)((0xe6 < bVar9) * bVar9 | (0xe6 >= bVar9) * -0x1a) == bVar9) & 0xe0U)
                     + pcVar3[-0xb];
      pcVar3[-10] = (-((byte)((0xe6 < bVar10) * bVar10 | (0xe6 >= bVar10) * -0x1a) == bVar10) &
                    0xe0U) + pcVar3[-10];
      pcVar3[-9] = (-((byte)((0xe6 < bVar11) * bVar11 | (0xe6 >= bVar11) * -0x1a) == bVar11) & 0xe0U
                   ) + pcVar3[-9];
      pcVar3[-8] = (-((byte)((0xe6 < bVar12) * bVar12 | (0xe6 >= bVar12) * -0x1a) == bVar12) & 0xe0U
                   ) + pcVar3[-8];
      pcVar3[-7] = (-((byte)((0xe6 < bVar13) * bVar13 | (0xe6 >= bVar13) * -0x1a) == bVar13) & 0xe0U
                   ) + pcVar3[-7];
      pcVar3[-6] = (-((byte)((0xe6 < bVar14) * bVar14 | (0xe6 >= bVar14) * -0x1a) == bVar14) & 0xe0U
                   ) + pcVar3[-6];
      pcVar3[-5] = (-((byte)((0xe6 < bVar15) * bVar15 | (0xe6 >= bVar15) * -0x1a) == bVar15) & 0xe0U
                   ) + pcVar3[-5];
      pcVar3[-4] = (-((byte)((0xe6 < bVar16) * bVar16 | (0xe6 >= bVar16) * -0x1a) == bVar16) & 0xe0U
                   ) + pcVar3[-4];
      pcVar3[-3] = (-((byte)((0xe6 < bVar17) * bVar17 | (0xe6 >= bVar17) * -0x1a) == bVar17) & 0xe0U
                   ) + pcVar3[-3];
      pcVar3[-2] = (-((byte)((0xe6 < bVar18) * bVar18 | (0xe6 >= bVar18) * -0x1a) == bVar18) & 0xe0U
                   ) + pcVar3[-2];
      pcVar3[-1] = (-((byte)((0xe6 < bVar19) * bVar19 | (0xe6 >= bVar19) * -0x1a) == bVar19) & 0xe0U
                   ) + pcVar3[-1];
    }
  }
  return;
}

Assistant:

CORRADE_UTILITY_CPU_MAYBE_UNUSED CORRADE_ENABLE_SSE2 typename std::decay<decltype(lowercaseInPlace)>::type uppercaseInPlaceImplementation(Cpu::Sse2T) {
  return [](char* const data, const std::size_t size) CORRADE_ENABLE_SSE2 {
    char* const end = data + size;

    /* If we have less than 16 bytes, do it the stupid way, equivalent to the
       scalar variant and just unrolled. */
    /** @todo investigate perf implications of putting this into a helper
        function that's reused across all SSE / NEON / WASM SIMD variants --
        the way it is now there's just one jump into the switch, with the
        helper it'd be another if() around */
    {
        char* j = data;
        switch(size) {
            case 15: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case 14: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case 13: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case 12: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case 11: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case 10: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  9: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  8: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  7: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  6: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  5: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  4: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  3: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  2: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  1: *j -= (std::uint8_t(*j - 'a') < 26) << 5; ++j; CORRADE_FALLTHROUGH
            case  0: return;
        }
    }

    /* Core algorithm */
    const __m128i aAndAbove = _mm_set1_epi8(char(256u - std::uint8_t('a')));
    const __m128i lowest25 = _mm_set1_epi8(25);
    const __m128i lowercaseBit = _mm_set1_epi8(0x20);
    const auto uppercaseOneVector = [&](const __m128i chars) CORRADE_ENABLE_SSE2 {
        /* Moves 'a' and everything above to 0 and up (it overflows and wraps
           around) */
        const __m128i lowercaseInLowest25 = _mm_add_epi8(chars, aAndAbove);
        /* Subtracts 25 with saturation, which makes the original 'a' to 'z'
           (now 0 to 25) zero and everything else non-zero */
        const __m128i lowest25IsZero = _mm_subs_epu8(lowercaseInLowest25, lowest25);
        /* Mask indicating where uppercase letters where, i.e. which values are
           now zero */
        const __m128i maskUppercase = _mm_cmpeq_epi8(lowest25IsZero, _mm_setzero_si128());
        /* For the masked chars a lowercase bit is set, and the bit is then
           subtracted from the original chars, making the lowercase chars
           uppercase */
        return _mm_sub_epi8(chars, _mm_and_si128(maskUppercase, lowercaseBit));
    };

    /* Unconditionally convert the first vector in a slower, unaligned way. Any
       extra branching to avoid the unaligned load & store if already aligned
       would be most probably more expensive than the actual operation. */
    {
        const __m128i chars = _mm_loadu_si128(reinterpret_cast<const __m128i*>(data));
        _mm_storeu_si128(reinterpret_cast<__m128i*>(data), uppercaseOneVector(chars));
    }

    /* Go to the next aligned position. If the pointer was already aligned,
       we'll go to the next aligned vector; if not, there will be an overlap
       and we'll convert some bytes twice. Which is fine, uppercasing
       already-uppercased data is a no-op. */
    char* i = reinterpret_cast<char*>(reinterpret_cast<std::uintptr_t>(data + 16) & ~0xf);
    CORRADE_INTERNAL_DEBUG_ASSERT(i >= data && reinterpret_cast<std::uintptr_t>(i) % 16 == 0);

    /* Convert all aligned vectors using aligned load/store */
    for(; i + 16 <= end; i += 16) {
        const __m128i chars = _mm_load_si128(reinterpret_cast<const __m128i*>(i));
        _mm_store_si128(reinterpret_cast<__m128i*>(i), uppercaseOneVector(chars));
    }

    /* Handle remaining less than a vector with an unaligned load & store,
       again overlapping back with the previous already-converted elements */
    if(i < end) {
        CORRADE_INTERNAL_DEBUG_ASSERT(i + 16 > end);
        i = end - 16;
        const __m128i chars = _mm_loadu_si128(reinterpret_cast<const __m128i*>(i));
        _mm_storeu_si128(reinterpret_cast<__m128i*>(i), uppercaseOneVector(chars));
    }
  };
}